

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O1

void m256v_multadd_row_from(m256v *M1,int r1,int offs,uint8_t alpha,m256v *Mt,int rt)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  undefined7 in_register_00000009;
  long lVar9;
  
  iVar8 = (int)CONCAT71(in_register_00000009,alpha);
  if (iVar8 != 0) {
    if (iVar8 == 1) {
      lVar7 = (long)r1 * M1->rstride;
      lVar9 = (long)offs;
      puVar1 = M1->e;
      iVar8 = M1->n_col;
      if (puVar1 + lVar9 + lVar7 < puVar1 + iVar8 + lVar7) {
        sVar2 = Mt->rstride;
        puVar3 = Mt->e;
        do {
          puVar3[lVar9 + (long)rt * sVar2] =
               puVar3[lVar9 + (long)rt * sVar2] ^ puVar1[lVar9 + lVar7];
          lVar9 = lVar9 + 1;
        } while (iVar8 != lVar9);
      }
    }
    else {
      iVar5 = gf256_log(alpha);
      lVar9 = (long)r1 * M1->rstride;
      lVar7 = (long)offs;
      puVar1 = M1->e;
      iVar8 = M1->n_col;
      if (puVar1 + lVar7 + lVar9 < puVar1 + iVar8 + lVar9) {
        sVar2 = Mt->rstride;
        puVar3 = Mt->e;
        do {
          if (puVar1[lVar7 + lVar9] != '\0') {
            iVar6 = gf256_log(puVar1[lVar7 + lVar9]);
            bVar4 = gf256_exp(iVar6 + iVar5);
            puVar3[lVar7 + (long)rt * sVar2] = puVar3[lVar7 + (long)rt * sVar2] ^ bVar4;
          }
          lVar7 = lVar7 + 1;
        } while (iVar8 != lVar7);
      }
    }
  }
  return;
}

Assistant:

void m256v_multadd_row_from(const m256v* M1,
			int r1,
			int offs,
			uint8_t alpha,
			m256v* Mt,
			int rt)
{
	assert (M1->n_col == Mt->n_col);

	if (alpha == 0)
		return;
	if (alpha == 1) {
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			*t++ ^= *s++;
		}
	} else {
		const int log_alpha = flog(alpha);
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			/* Mt[rt, i] += exp(log_alpha + log(M1[r1, i]))
			 * if said logarithm is defined.
			 *
			 * Otherwise, M[rt, i] is unchanged.
			 */
			const uint8_t ve = *s++;
			if (ve != 0) {
				*t ^= fexp(log_alpha + flog(ve));
			}
			++t;
		}
	}
}